

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_loadrecord.c
# Opt level: O1

_Bool check(staticCache *cache,char *q,char *a)

{
  int iVar1;
  static_record_data *psVar2;
  
  psVar2 = get_static_cache(cache,q);
  while( true ) {
    if (psVar2 == (static_record_data *)0x0) {
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_loadrecord.c"
              ,0x12,"error:%s %s %s",q,a,check::buffer);
      exit(1);
    }
    inet_ntop(2,&psVar2->ip,check::buffer,0x100);
    iVar1 = strcmp(check::buffer,a);
    if (iVar1 == 0) break;
    psVar2 = psVar2->next;
  }
  return true;
}

Assistant:

bool check(struct staticCache* cache ,const char *q,const char* a){
    static char buffer[256];
    struct static_record_data *pdata = get_static_cache(cache,q);
    while(pdata){
        inet_ntop(AF_INET,&pdata->ip, buffer, sizeof(buffer));
        if(pdata!=NULL && !strcmp(buffer,a)){
            return true;
        }
        pdata=pdata->next;
    }
    log_error("error:%s %s %s",q,a,buffer);
    exit(EXIT_FAILURE);
}